

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O2

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderEmulatingMultiobj
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer *this_01;
  _Base_ptr *pp_Var1;
  Type TVar2;
  double dVar3;
  Type TVar4;
  pointer pQVar5;
  pointer pdVar6;
  BasicSolver *this_02;
  int iVar7;
  mapped_type *this_03;
  reference pvVar8;
  const_reference pvVar9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  double dVar12;
  _Vector_base<double,_std::allocator<double>_> _Stack_2b0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  _Stack_298;
  vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_> *pvStack_268;
  value_type *pvStack_260;
  _Rb_tree_node_base *p_Stack_258;
  vector<double,_std::allocator<double>_> *pvStack_250;
  vector<double,_std::allocator<double>_> *pvStack_248;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pMStack_240;
  double dStack_238;
  _Vector_base<double,_std::allocator<double>_> _Stack_230;
  _Vector_base<double,_std::allocator<double>_> _Stack_218;
  _Vector_base<int,_std::allocator<int>_> _Stack_200;
  LinTerms LStack_1e8;
  undefined1 auStack_170 [320];
  
  this->status_ = NOT_ACTIVE;
  if ((1 < (int)(((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x1e8)) &&
     ((pQVar5 = this[2].obj_new_.
                super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
                _M_impl.super__Vector_impl_data._M_start,
      *(char *)((long)&pQVar5[1].super_NLObjective.super_LinearObjective.lt_ + 0x54) != '\x01' ||
      ((*(int *)&(pQVar5->qt_).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long> < 0 &&
       (1 < *(int *)((long)&pQVar5[1].super_NLObjective.super_LinearObjective.lt_ + 0x50))))))) {
    auStack_170._16_4_ = 2;
    this->status_ = RUNNING;
    *(undefined1 *)&this[-1].i_current_obj_ = 1;
    pp_Var1 = &_Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)_Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
    auStack_170._0_8_ = "objpriority";
    auStack_170._8_8_ = (pointer)0xb;
    _Stack_298._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::string((string *)(auStack_170 + 0x18),(string *)&_Stack_298);
    std::function<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&)>::operator()
              ((ArrayRef<int> *)&LStack_1e8,
               (function<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&)> *)&this[9].objval_last_,
               (SuffixDef<int> *)auStack_170);
    ArrayRef<int>::move_or_copy
              ((vector<int,_std::allocator<int>_> *)&_Stack_200,(ArrayRef<int> *)&LStack_1e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&LStack_1e8);
    std::__cxx11::string::~string((string *)(auStack_170 + 0x18));
    std::__cxx11::string::~string((string *)&_Stack_298);
    auStack_170._0_8_ = auStack_170._0_8_ & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&_Stack_200,
               ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x1e8,(value_type *)auStack_170);
    GetMOWeightsLegacy((ArrayRef<double> *)auStack_170,this);
    ArrayRef<double>::move_or_copy
              ((vector<double,_std::allocator<double>_> *)&_Stack_2b0,
               (ArrayRef<double> *)auStack_170);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)auStack_170);
    if (_Stack_2b0._M_impl.super__Vector_impl_data._M_start ==
        _Stack_2b0._M_impl.super__Vector_impl_data._M_finish) {
      auStack_170._0_8_ = (ptr)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)&_Stack_2b0,
                 ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x1e8,
                 (value_type_conflict3 *)auStack_170);
      FlipDiffSenseSigns(this,(vector<double,_std::allocator<double>_> *)&_Stack_2b0);
    }
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)_Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
    auStack_170._0_8_ = "objabstol";
    auStack_170._8_8_ = (pointer)0x9;
    auStack_170._16_4_ = 2;
    _Stack_298._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::string((string *)(auStack_170 + 0x18),(string *)&_Stack_298);
    this_01 = &this[10].obj_new_.
               super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::function<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&)>::operator()
              ((ArrayRef<double> *)&LStack_1e8,
               (function<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&)> *)this_01,
               (SuffixDef<double> *)auStack_170);
    ArrayRef<double>::move_or_copy
              ((vector<double,_std::allocator<double>_> *)&_Stack_218,
               (ArrayRef<double> *)&LStack_1e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&LStack_1e8);
    std::__cxx11::string::~string((string *)(auStack_170 + 0x18));
    std::__cxx11::string::~string((string *)&_Stack_298);
    auStack_170._0_8_ = (ptr)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&_Stack_218,
               ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x1e8,
               (value_type_conflict3 *)auStack_170);
    _Stack_298._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)_Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
    auStack_170._0_8_ = "objreltol";
    auStack_170._8_8_ = (pointer)0x9;
    auStack_170._16_4_ = 2;
    _Stack_298._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::string((string *)(auStack_170 + 0x18),(string *)&_Stack_298);
    std::function<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&)>::operator()
              ((ArrayRef<double> *)&LStack_1e8,
               (function<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&)> *)this_01,
               (SuffixDef<double> *)auStack_170);
    ArrayRef<double>::move_or_copy
              ((vector<double,_std::allocator<double>_> *)&_Stack_230,
               (ArrayRef<double> *)&LStack_1e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&LStack_1e8);
    std::__cxx11::string::~string((string *)(auStack_170 + 0x18));
    std::__cxx11::string::~string((string *)&_Stack_298);
    auStack_170._0_8_ = (ptr)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&_Stack_230,
               ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x1e8,
               (value_type_conflict3 *)auStack_170);
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_298._M_impl.super__Rb_tree_header._M_header;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._0_8_ =
         _Stack_298._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_298._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this[-1].obj_new_tolr_;
    iVar7 = 0;
    _Stack_298._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_298._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      auStack_170._0_4_ = iVar7;
      if ((ulong)((long)_Stack_200._M_impl.super__Vector_impl_data._M_finish -
                  (long)_Stack_200._M_impl.super__Vector_impl_data._M_start >> 2) <=
          (ulong)(long)iVar7) break;
      this_03 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)&_Stack_298,
                             _Stack_200._M_impl.super__Vector_impl_data._M_start + iVar7);
      std::vector<int,_std::allocator<int>_>::push_back(this_03,(value_type *)auStack_170);
      iVar7 = auStack_170._0_4_ + 1;
    }
    pvStack_268 = &this->obj_new_;
    std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::operator=
              (pvStack_268,(initializer_list<mp::QuadraticObjective>)ZEXT816(0));
    std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::reserve
              (pvStack_268,_Stack_298._M_impl.super__Rb_tree_header._M_node_count);
    pvStack_248 = &this->obj_new_tola_;
    std::vector<double,_std::allocator<double>_>::reserve
              (pvStack_248,_Stack_298._M_impl.super__Rb_tree_header._M_node_count);
    pvStack_250 = &this->obj_new_tolr_;
    std::vector<double,_std::allocator<double>_>::reserve
              (pvStack_250,_Stack_298._M_impl.super__Rb_tree_header._M_node_count);
    pMStack_240 = this;
    for (p_Var10 = _Stack_298._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &_Stack_298._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      pvStack_260 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::at
                              ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                                *)this_00,(long)(int)(p_Var10[1]._M_parent)->_M_color);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&_Stack_2b0,
                          (long)(int)(p_Var10[1]._M_parent)->_M_color);
      dVar3 = *pvVar8;
      std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::push_back
                (pvStack_268,pvStack_260);
      pQVar5 = (this->obj_new_).
               super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      *(double *)&pQVar5[-1].super_NLObjective.super_LinearObjective =
           *this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      LinTerms::operator*=(&pQVar5[-1].super_NLObjective.super_LinearObjective.lt_,dVar3);
      QuadTerms::operator*=
                (&(this->obj_new_).
                  super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].qt_,dVar3);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&_Stack_218,
                          (long)(int)(p_Var10[1]._M_parent)->_M_color);
      std::vector<double,_std::allocator<double>_>::push_back(pvStack_248,pvVar8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&_Stack_230,
                          (long)(int)(p_Var10[1]._M_parent)->_M_color);
      std::vector<double,_std::allocator<double>_>::push_back(pvStack_250,pvVar8);
      p_Stack_258 = p_Var10;
      for (lVar11 = (long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent >> 2; lVar11 != 1;
          lVar11 = lVar11 + -1) {
        TVar4 = (pvStack_260->super_NLObjective).super_LinearObjective.sense_;
        pvVar9 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::at
                           ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                             *)this_00,(long)*(int *)((long)p_Var10[1]._M_parent + lVar11 * 4 + -4))
        ;
        TVar2 = (pvVar9->super_NLObjective).super_LinearObjective.sense_;
        pvVar9 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::at
                           ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                             *)this_00,(long)*(int *)((long)p_Var10[1]._M_parent + lVar11 * 4 + -4))
        ;
        LinTerms::LinTerms(&LStack_1e8,&(pvVar9->super_NLObjective).super_LinearObjective.lt_);
        p_Var10 = p_Stack_258;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&_Stack_2b0,
                            (long)*(int *)((long)p_Stack_258[1]._M_parent + lVar11 * 4 + -4));
        dStack_238 = *(double *)(&DAT_00366440 + (ulong)(TVar4 == TVar2) * 8);
        LinTerms::operator*=(&LStack_1e8,*pvVar8 * dStack_238);
        pvVar9 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::at
                           ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                             *)this_00,(long)*(int *)((long)p_Var10[1]._M_parent + lVar11 * 4 + -4))
        ;
        QuadTerms::QuadTerms((QuadTerms *)auStack_170,&pvVar9->qt_);
        p_Var10 = p_Stack_258;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&_Stack_2b0,
                            (long)*(int *)((long)p_Stack_258[1]._M_parent + lVar11 * 4 + -4));
        this = pMStack_240;
        QuadTerms::operator*=((QuadTerms *)auStack_170,dStack_238 * *pvVar8);
        LinTerms::add(&(this->obj_new_).
                       super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].super_NLObjective.
                       super_LinearObjective.lt_,&LStack_1e8);
        QuadTerms::add(&(this->obj_new_).
                        super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].qt_,(QuadTerms *)auStack_170)
        ;
        pdVar6 = (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&_Stack_218,
                            (long)*(int *)((long)p_Var10[1]._M_parent + lVar11 * 4 + -4));
        dVar3 = pdVar6[-1];
        dVar12 = *pvVar8;
        if (*pvVar8 <= dVar3) {
          dVar12 = dVar3;
        }
        (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] = dVar12;
        pdVar6 = (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&_Stack_230,
                            (long)*(int *)((long)p_Var10[1]._M_parent + lVar11 * 4 + -4));
        dVar3 = pdVar6[-1];
        dVar12 = *pvVar8;
        if (*pvVar8 <= dVar3) {
          dVar12 = dVar3;
        }
        (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] = dVar12;
        QuadTerms::~QuadTerms((QuadTerms *)auStack_170);
        LinTerms::~LinTerms(&LStack_1e8);
      }
      LinTerms::sort_terms
                (&(this->obj_new_).
                  super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].super_NLObjective.
                  super_LinearObjective.lt_,true);
      QuadTerms::sort_terms
                (&(this->obj_new_).
                  super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].qt_);
    }
    this_02 = (BasicSolver *)
              this[2].obj_new_.
              super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this_02->verbose_ != false) {
      auStack_170._0_8_ =
           ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_finish -
           (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x1e8;
      LStack_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)(((long)(this->obj_new_).
                        super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->obj_new_).
                       super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x1e8);
      BasicSolver::Print<unsigned_long,unsigned_long>
                (this_02,(CStringRef)0x368875,(unsigned_long *)auStack_170,
                 (unsigned_long *)&LStack_1e8);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&_Stack_298);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_230);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_218);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_2b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_200);
    return;
  }
  return;
}

Assistant:

void ConsiderEmulatingMultiobj() {
    status_ = MOManagerStatus::NOT_ACTIVE;
    if (MPCD(num_objs())>1                                  // have multiple objectives
        && (MPCD(GetEnv()).multiobj_has_native()==false
            || MPCD(GetEnv()).multiobj()>1))                // force emulation
      SetupMultiobjEmulation();
    // Anything todo otherwise?
  }